

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_Serialize(ktxHashList *pHead,uint *pKvdLen,uchar **ppKvd)

{
  ktxHashList pkVar1;
  uint *puVar2;
  ulong uVar3;
  uchar *puVar4;
  uint uVar5;
  size_t __n;
  float fVar6;
  undefined1 auVar7 [16];
  char padding [4];
  undefined4 local_2c;
  
  if (ppKvd == (uchar **)0x0 || (pKvdLen == (uint *)0x0 || pHead == (ktxHashList *)0x0)) {
    return KTX_INVALID_VALUE;
  }
  local_2c = 0;
  pkVar1 = *pHead;
  if (pkVar1 != (ktxHashList)0x0) {
    uVar5 = 0;
    do {
      auVar7 = ZEXT416((uint)((float)(pkVar1->keyLen + pkVar1->valueLen + 4) * 0.25));
      auVar7 = roundss(auVar7,auVar7,10);
      uVar5 = uVar5 + (int)(long)(auVar7._0_4_ * 4.0);
      pkVar1 = (ktxHashList)(pkVar1->hh).next;
    } while (pkVar1 != (ktxHashList)0x0);
    if (uVar5 != 0) {
      puVar2 = (uint *)malloc((ulong)uVar5);
      if (puVar2 == (uint *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      *pKvdLen = uVar5;
      *ppKvd = (uchar *)puVar2;
      pkVar1 = *pHead;
      if (pkVar1 == (ktxHashList)0x0) {
        return KTX_SUCCESS;
      }
      do {
        uVar5 = pkVar1->valueLen + pkVar1->keyLen;
        *puVar2 = uVar5;
        memcpy(puVar2 + 1,pkVar1->key,(ulong)pkVar1->keyLen);
        puVar4 = (uchar *)((long)puVar2 + (ulong)pkVar1->keyLen + 4);
        if ((ulong)pkVar1->valueLen == 0) {
          uVar3 = 0;
        }
        else {
          memcpy(puVar4,pkVar1->value,(ulong)pkVar1->valueLen);
          uVar3 = (ulong)pkVar1->valueLen;
        }
        puVar4 = puVar4 + uVar3;
        fVar6 = (float)uVar5;
        auVar7 = ZEXT416((uint)(fVar6 * 0.25));
        auVar7 = roundss(auVar7,auVar7,10);
        __n = (size_t)(int)(long)(auVar7._0_4_ * 4.0 - fVar6);
        memcpy(puVar4,&local_2c,__n);
        puVar2 = (uint *)(puVar4 + __n);
        pkVar1 = (ktxHashList)(pkVar1->hh).next;
      } while (pkVar1 != (ktxHashList)0x0);
      return KTX_SUCCESS;
    }
  }
  *pKvdLen = 0;
  *ppKvd = (uchar *)0x0;
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
ktxHashList_Serialize(ktxHashList* pHead,
                      unsigned int* pKvdLen, unsigned char** ppKvd)
{

    if (pHead && pKvdLen && ppKvd) {
        ktxKVListEntry* kv;
        unsigned int bytesOfKeyValueData = 0;
        unsigned int keyValueLen;
        unsigned char* sd;
        char padding[4] = {0, 0, 0, 0};

        for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
            /* sizeof(sd) is to make space to write keyAndValueByteSize */
            keyValueLen = kv->keyLen + kv->valueLen + sizeof(ktx_uint32_t);
            /* Add valuePadding */
            keyValueLen = _KTX_PAD4(keyValueLen);
            bytesOfKeyValueData += keyValueLen;
        }

        if (bytesOfKeyValueData == 0) {
            *pKvdLen = 0;
            *ppKvd = NULL;
        } else {
            sd = malloc(bytesOfKeyValueData);
            if (!sd)
                return KTX_OUT_OF_MEMORY;

            *pKvdLen = bytesOfKeyValueData;
            *ppKvd = sd;

            for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
                int padLen;

                keyValueLen = kv->keyLen + kv->valueLen;
                *(ktx_uint32_t*)sd = keyValueLen;
                sd += sizeof(ktx_uint32_t);
                memcpy(sd, kv->key, kv->keyLen);
                sd += kv->keyLen;
                if (kv->valueLen > 0)
                    memcpy(sd, kv->value, kv->valueLen);
                sd += kv->valueLen;
                padLen = _KTX_PAD4_LEN(keyValueLen);
                memcpy(sd, padding, padLen);
                sd += padLen;
            }
        }
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}